

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_xml.cc
# Opt level: O2

void __thiscall iqxmlrpc::Value_type_to_xml::do_visit_int(Value_type_to_xml *this,int val)

{
  int *in_RDX;
  int local_34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_34 = val;
  boost::lexical_cast<std::__cxx11::string,int>(&local_30,(boost *)&local_34,in_RDX);
  add_textnode(this,"i4",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Value_type_to_xml::do_visit_int(int val)
{
  add_textnode("i4", boost::lexical_cast<std::string>(val));
}